

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O3

int magma_cipher_do_cbc(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  undefined8 uVar1;
  int iVar2;
  long lVar3;
  undefined8 *puVar4;
  long lVar5;
  uchar b [8];
  byte local_38 [8];
  
  lVar3 = EVP_CIPHER_CTX_get_cipher_data();
  puVar4 = (undefined8 *)EVP_CIPHER_CTX_iv_noconst(ctx);
  iVar2 = EVP_CIPHER_CTX_is_encrypting(ctx);
  if (iVar2 == 0) {
    if (inl != 0) {
      do {
        magmadecrypt((gost_ctx *)(lVar3 + 0x1c),in,local_38);
        uVar1 = *(undefined8 *)in;
        lVar5 = 0;
        do {
          out[lVar5] = local_38[lVar5] ^ *(byte *)((long)puVar4 + lVar5);
          lVar5 = lVar5 + 1;
        } while (lVar5 != 8);
        *puVar4 = uVar1;
        out = out + 8;
        in = in + 8;
        inl = inl - 8;
      } while (inl != 0);
    }
  }
  else if (inl != 0) {
    do {
      lVar5 = 0;
      do {
        out[lVar5] = in[lVar5] ^ *(byte *)((long)puVar4 + lVar5);
        lVar5 = lVar5 + 1;
      } while (lVar5 != 8);
      magmacrypt((gost_ctx *)(lVar3 + 0x1c),out,out);
      *puVar4 = *(undefined8 *)out;
      out = out + 8;
      in = in + 8;
      inl = inl - 8;
    } while (inl != 0);
  }
  return 1;
}

Assistant:

static int magma_cipher_do_cbc(EVP_CIPHER_CTX *ctx, unsigned char *out,
                        const unsigned char *in, size_t inl)
{
    unsigned char b[8];
    unsigned char d[8];
    const unsigned char *in_ptr = in;
    unsigned char *out_ptr = out;
    int i;
    struct ossl_gost_cipher_ctx *c = EVP_CIPHER_CTX_get_cipher_data(ctx);
    unsigned char *iv = EVP_CIPHER_CTX_iv_noconst(ctx);
    if (EVP_CIPHER_CTX_encrypting(ctx)) {
        while (inl > 0) {

            for (i = 0; i < 8; i++) {
                out_ptr[i] = iv[i] ^ in_ptr[i];
            }
            magmacrypt(&(c->cctx), out_ptr, out_ptr);
            memcpy(iv, out_ptr, 8);
            out_ptr += 8;
            in_ptr += 8;
            inl -= 8;
        }
    } else {
        while (inl > 0) {
            magmadecrypt(&(c->cctx), in_ptr, b);
            memcpy(d, in_ptr, 8);
            for (i = 0; i < 8; i++) {
                out_ptr[i] = iv[i] ^ b[i];
            }
            memcpy(iv, d, 8);
            out_ptr += 8;
            in_ptr += 8;
            inl -= 8;
        }
    }
    return 1;
}